

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_0::getIOSubVariableLocation
              (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               *path,int startNdx,int currentLocation)

{
  Type TVar1;
  pointer pSVar2;
  int iVar3;
  pointer pVVar4;
  int ndx;
  long lVar5;
  int iVar6;
  VarType *type;
  VarType *this;
  long lVar7;
  
  while( true ) {
    lVar7 = 0x20;
    if (currentLocation == -1) {
      return -1;
    }
    pVVar4 = (path->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar6 = startNdx;
    while( true ) {
      type = pVVar4[iVar6].m_data.type;
      TVar1 = type->m_type;
      if (TVar1 != TYPE_ARRAY) break;
      iVar6 = iVar6 + 1;
    }
    if (TVar1 == TYPE_BASIC) break;
    if (TVar1 != TYPE_STRUCT) {
      return -1;
    }
    startNdx = iVar6 + 1;
    lVar5 = 0;
    while( true ) {
      pSVar2 = (((type->m_data).structPtr)->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)(((long)(((type->m_data).structPtr)->m_members).
                       super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x38) <= lVar5) {
        return -1;
      }
      this = (VarType *)((long)&(pSVar2->m_name)._M_dataplus._M_p + lVar7);
      if (this == pVVar4[startNdx].m_data.type) break;
      iVar3 = -1;
      if (currentLocation != -1) {
        iVar3 = getVariableLocationLength((anon_unknown_0 *)this,type);
        pVVar4 = (path->
                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        type = pVVar4[iVar6].m_data.type;
        iVar3 = iVar3 + currentLocation;
      }
      currentLocation = iVar3;
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x38;
    }
  }
  return currentLocation;
}

Assistant:

static int getIOSubVariableLocation (const std::vector<VariablePathComponent>& path, int startNdx, int currentLocation)
{
	if (currentLocation == -1)
		return -1;

	if (path[startNdx].getVariableType()->isBasicType())
		return currentLocation;
	else if (path[startNdx].getVariableType()->isArrayType())
		return getIOSubVariableLocation(path, startNdx+1, currentLocation);
	else if (path[startNdx].getVariableType()->isStructType())
	{
		for (int ndx = 0; ndx < path[startNdx].getVariableType()->getStructPtr()->getNumMembers(); ++ndx)
		{
			if (&path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType() == path[startNdx + 1].getVariableType())
				return getIOSubVariableLocation(path, startNdx + 1, currentLocation);

			if (currentLocation != -1)
				currentLocation += getVariableLocationLength(path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType());
		}

		// could not find member, never happens
		DE_ASSERT(false);
		return -1;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}